

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.cpp
# Opt level: O1

shared_ptr<duckdb::Relation,_true> __thiscall
duckdb::Relation::Intersect(Relation *this,shared_ptr<duckdb::Relation,_true> *other)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  shared_ptr<duckdb::Relation,_true> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<duckdb::Relation,_true> sVar3;
  bool local_4b;
  SetOperationType local_4a;
  undefined1 local_49;
  shared_ptr<duckdb::SetOpRelation,_true> local_48;
  enable_shared_from_this<duckdb::Relation> local_38;
  shared_ptr<duckdb::SetOpRelation> local_28;
  
  enable_shared_from_this<duckdb::Relation>::shared_from_this(&local_38);
  local_4a = INTERSECT;
  local_4b = true;
  local_28.super___shared_ptr<duckdb::SetOpRelation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::SetOpRelation,std::allocator<duckdb::SetOpRelation>,duckdb::shared_ptr<duckdb::Relation,true>,duckdb::shared_ptr<duckdb::Relation,true>const&,duckdb::SetOperationType,bool>
            (&local_28.super___shared_ptr<duckdb::SetOpRelation,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(SetOpRelation **)&local_28,(allocator<duckdb::SetOpRelation> *)&local_49,
             (shared_ptr<duckdb::Relation,_true> *)&local_38,in_RDX,&local_4a,&local_4b);
  shared_ptr<duckdb::SetOpRelation,_true>::shared_ptr(&local_48,&local_28);
  _Var2._M_pi = extraout_RDX;
  if (local_28.super___shared_ptr<duckdb::SetOpRelation,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<duckdb::SetOpRelation,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var2._M_pi = extraout_RDX_00;
  }
  _Var1._M_pi = local_48.internal.
                super___shared_ptr<duckdb::SetOpRelation,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  (this->super_enable_shared_from_this<duckdb::Relation>).__weak_this_.internal.
  super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_48.internal.super___shared_ptr<duckdb::SetOpRelation,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->_vptr_Relation =
       (_func_int **)
       local_48.internal.super___shared_ptr<duckdb::SetOpRelation,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  (this->super_enable_shared_from_this<duckdb::Relation>).__weak_this_.internal.
  super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var1._M_pi;
  local_48.internal.super___shared_ptr<duckdb::SetOpRelation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  if (local_38.__weak_this_.internal.super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.__weak_this_.internal.
               super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    _Var2._M_pi = extraout_RDX_01;
  }
  sVar3.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var2._M_pi;
  sVar3.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<duckdb::Relation,_true>)
         sVar3.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<Relation> Relation::Intersect(const shared_ptr<Relation> &other) {
	return make_shared_ptr<SetOpRelation>(shared_from_this(), other, SetOperationType::INTERSECT, true);
}